

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_SelectCoinsBnB_with_asset_Test::TestBody
          (CoinSelection_SelectCoins_SelectCoinsBnB_with_asset_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  char *pcVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  char *in_R9;
  Amount AVar9;
  void *in_stack_00000098;
  string *in_stack_000000a0;
  Amount *in_stack_000000a8;
  string *in_stack_000000b0;
  uint32_t in_stack_000000bc;
  Txid *in_stack_000000c0;
  Utxo *in_stack_000000d0;
  Script *in_stack_000000d8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  CoinSelectionOption *in_stack_000001e8;
  UtxoFilter *in_stack_000001f0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_000001f8;
  AssertionResult gtest_ar_4;
  Amount *in_stack_00000220;
  AmountMap *in_stack_00000228;
  AssertionResult gtest_ar_3;
  AmountMap *in_stack_00000240;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> select_utxos;
  CoinSelectionOption option_params;
  Txid txid;
  TestElementsUtxoCoinVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *__range1;
  iterator ite;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  Amount tx_fee;
  Amount fee;
  AmountMap map_select_value;
  AmountMap map_target_amount;
  CoinSelection coin_select;
  reference in_stack_fffffffffffffac8;
  CoinSelectionOption *in_stack_fffffffffffffad0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffad8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffae0;
  char *in_stack_fffffffffffffae8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffaf0;
  key_type *in_stack_fffffffffffffb08;
  undefined7 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb17;
  string local_430;
  AssertHelper local_410;
  Message local_408;
  string local_400;
  AssertionResult local_3e0;
  AssertHelper local_3d0;
  Message local_3c8;
  undefined4 local_3bc;
  size_type local_3b8;
  AssertionResult local_3b0;
  AssertHelper local_3a0;
  Message local_398;
  undefined4 local_38c;
  int64_t local_388;
  AssertionResult local_380;
  AssertHelper local_370;
  Message local_368;
  undefined4 local_35c;
  string local_358;
  AssertionResult local_338;
  AssertHelper local_328;
  Message local_320;
  undefined4 local_314;
  size_type local_310;
  AssertionResult local_308;
  AssertHelper local_2f8;
  Message local_2f0;
  undefined8 local_2e8;
  AssertionResult local_2e0;
  AssertHelper local_2d0;
  Message local_2c8;
  undefined8 local_2c0;
  AssertionResult local_2b8;
  AssertHelper local_2a8;
  Message local_2a0;
  undefined4 local_294;
  size_type local_290;
  AssertionResult local_288;
  AssertHelper local_278;
  Message local_270 [5];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_248;
  char local_230 [96];
  CoinSelectionOption *in_stack_fffffffffffffe30;
  Txid local_1a8;
  Txid local_188;
  reference local_168;
  TestElementsUtxoCoinVector *local_160;
  __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
  local_158;
  vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *local_150;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_148 [4];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_128 [2];
  uint64_t local_f8;
  undefined1 local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [80];
  string local_88 [4];
  
  cfd::CoinSelection::CoinSelection
            ((CoinSelection *)in_stack_fffffffffffffad0,
             SUB81((ulong)in_stack_fffffffffffffac8 >> 0x38,0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x27a8de);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_88,&exp_dummy_asset_a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                        in_stack_fffffffffffffb08);
  *pmVar3 = 0x5f5db24;
  std::__cxx11::string::~string((string *)local_88);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x27a93c);
  cfd::core::Amount::Amount((Amount *)local_d8);
  AVar9 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_f8 = AVar9.amount_;
  local_f0 = AVar9.ignore_check_;
  local_e8._0_8_ = local_f8;
  local_e8[8] = local_f0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)0x27a9af);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x27a9c4);
  std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::size
            (&kExtCoinSelectElementsTestVector);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (in_stack_fffffffffffffaf0,(size_type)in_stack_fffffffffffffae8);
  local_148[0]._M_current =
       (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                         ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffffac8
                         );
  local_150 = &kExtCoinSelectElementsTestVector;
  local_158._M_current =
       (TestElementsUtxoCoinVector *)
       std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::begin
                 ((vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *
                  )in_stack_fffffffffffffac8);
  local_160 = (TestElementsUtxoCoinVector *)
              std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::
              end((vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *
                  )in_stack_fffffffffffffac8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffffad0,
                            (__normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffffac8), bVar1) {
    local_168 = __gnu_cxx::
                __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                ::operator*(&local_158);
    cfd::core::Txid::Txid(&local_188);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      cfd::core::Txid::Txid(&local_1a8,&local_168->txid);
      cfd::core::Txid::operator=(&local_188,&local_1a8);
      cfd::core::Txid::~Txid((Txid *)0x27aac0);
    }
    cfd::core::Amount::CreateBySatoshiAmount(local_168->amount);
    in_stack_fffffffffffffac8 =
         __gnu_cxx::
         __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
         operator*(local_148);
    in_stack_fffffffffffffad0 = (CoinSelectionOption *)0x0;
    in_R9 = (char *)0x0;
    cfd::CoinSelection::ConvertToUtxo
              (in_stack_000000c0,in_stack_000000bc,in_stack_000000b0,in_stack_000000a8,
               in_stack_000000a0,in_stack_00000098,in_stack_000000d0,in_stack_000000d8);
    __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
    operator++(local_148);
    cfd::core::Txid::~Txid((Txid *)0x27ac6b);
    __gnu_cxx::
    __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
    ::operator++(&local_158);
  }
  cfd::CoinSelectionOption::CoinSelectionOption(in_stack_fffffffffffffad0);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(in_stack_fffffffffffffe30);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            (in_stack_fffffffffffffad0,(double)in_stack_fffffffffffffac8);
  cfd::CoinSelectionOption::SetFeeAsset
            (in_stack_fffffffffffffad0,(ConfidentialAssetId *)in_stack_fffffffffffffac8);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x27ace7);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_fffffffffffffae0 = local_128;
      in_stack_fffffffffffffad8 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_d8;
      in_stack_fffffffffffffad0 = (CoinSelectionOption *)(local_d8 + 0x10);
      in_stack_fffffffffffffac8 = (reference)local_e8;
      in_stack_fffffffffffffae8 = (char *)0x0;
      in_R9 = local_230;
      cfd::CoinSelection::SelectCoins
                ((CoinSelection *)gtest_ar_4.message_.ptr_,(AmountMap *)gtest_ar_4._0_8_,
                 in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,in_stack_00000220,
                 in_stack_00000228,(Amount *)gtest_ar_3._0_8_,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)gtest_ar_3.message_.ptr_,in_stack_00000240);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffae0);
    }
  }
  else {
    testing::Message::Message(local_270);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x442,
               "Expected: (select_utxos = coin_select.SelectCoins(map_target_amount, utxos, exp_filter, option_params, tx_fee, &map_select_value, &fee, &map_searched_bnb)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_278,local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    testing::Message::~Message((Message *)0x27ae8e);
  }
  local_290 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_248);
  local_294 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
             (unsigned_long *)in_stack_fffffffffffffad8,(int *)in_stack_fffffffffffffad0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27af83);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x443,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    testing::Message::~Message((Message *)0x27afe6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27b03e);
  sVar6 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_248);
  if (sVar6 == 2) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_248,0);
    local_2c0 = 0x511f364;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
               (unsigned_long *)in_stack_fffffffffffffad8,(long *)in_stack_fffffffffffffad0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b8);
    if (!bVar1) {
      testing::Message::Message(&local_2c8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27b10d);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x445,pcVar5);
      testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      testing::Message::~Message((Message *)0x27b170);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27b1c5);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_248,1);
    local_2e8 = 0xe3f1de;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
               (unsigned_long *)in_stack_fffffffffffffad8,(long *)in_stack_fffffffffffffad0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
    if (!bVar1) {
      testing::Message::Message(&local_2f0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27b27e);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x446,pcVar5);
      testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
      testing::internal::AssertHelper::~AssertHelper(&local_2f8);
      testing::Message::~Message((Message *)0x27b2e1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27b336);
  }
  local_310 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      *)0x27b357);
  local_314 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
             (unsigned_long *)in_stack_fffffffffffffad8,(int *)in_stack_fffffffffffffad0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27b3f4);
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x448,pcVar5);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    testing::Message::~Message((Message *)0x27b457);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27b4af);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)0x27b4bc);
  if (sVar7 == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_358,&exp_dummy_asset_a);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                 in_stack_fffffffffffffb08);
    local_35c = 0x5f5e542;
    testing::internal::EqHelper<false>::Compare<long,int>
              (in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
               (long *)in_stack_fffffffffffffad8,(int *)in_stack_fffffffffffffad0);
    std::__cxx11::string::~string((string *)&local_358);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_338);
    if (!bVar1) {
      testing::Message::Message(&local_368);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27b5c9);
      testing::internal::AssertHelper::AssertHelper
                (&local_370,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x44a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_370,&local_368);
      testing::internal::AssertHelper::~AssertHelper(&local_370);
      testing::Message::~Message((Message *)0x27b626);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27b67b);
  }
  local_388 = cfd::core::Amount::GetSatoshiValue((Amount *)local_d8);
  local_38c = 0x170;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
             (long *)in_stack_fffffffffffffad8,(int *)in_stack_fffffffffffffad0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_380);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27b73f);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x44c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    testing::Message::~Message((Message *)0x27b79c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27b7f1);
  local_3b8 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                      *)0x27b7fe);
  local_3bc = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
             (unsigned_long *)in_stack_fffffffffffffad8,(int *)in_stack_fffffffffffffad0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_3c8);
    in_stack_fffffffffffffb08 =
         (key_type *)testing::AssertionResult::failure_message((AssertionResult *)0x27b8a7);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x44d,(char *)in_stack_fffffffffffffb08);
    testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    testing::Message::~Message((Message *)0x27b904);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27b95c);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)0x27b969);
  if (sVar8 == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_400,&exp_dummy_asset_a);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)CONCAT17(uVar2,in_stack_fffffffffffffb10),in_stack_fffffffffffffb08);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffad0,(bool *)in_stack_fffffffffffffac8,
               (type *)0x27b9bb);
    std::__cxx11::string::~string((string *)&local_400);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
    if (!bVar1) {
      testing::Message::Message(&local_408);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_430,(internal *)&local_3e0,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","false","true",
                 in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_410,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x44f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_410,&local_408);
      testing::internal::AssertHelper::~AssertHelper(&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      testing::Message::~Message((Message *)0x27bae6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27bb5e);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffae0);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x27bb89);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffae0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *)0x27bba3);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x27bbb0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x27bbbd);
  cfd::CoinSelection::~CoinSelection((CoinSelection *)0x27bbca);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_SelectCoinsBnB_with_asset)
{
  CoinSelection coin_select(true);
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 99998500;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;

  std::vector<Utxo> utxos;
  utxos.resize(kExtCoinSelectElementsTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectElementsTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), test_data.asset,
        nullptr, &(*ite));
    ++ite;
  }

  CoinSelectionOption option_params;
  option_params.InitializeConfidentialTxSizeInfo();
  option_params.SetEffectiveFeeBaserate(2);
  option_params.SetFeeAsset(exp_dummy_asset_a);

  std::vector<Utxo> select_utxos;
  EXPECT_NO_THROW((select_utxos = coin_select.SelectCoins(map_target_amount, utxos,
      exp_filter, option_params, tx_fee, &map_select_value, &fee, &map_searched_bnb)));
  EXPECT_EQ(select_utxos.size(), 2);
  if (select_utxos.size() == 2) {
    EXPECT_EQ(select_utxos[0].amount, static_cast<int64_t>(85062500));
    EXPECT_EQ(select_utxos[1].amount, static_cast<int64_t>(14938590));
  }
  EXPECT_EQ(map_select_value.size(), 1);
  if (map_select_value.size() == 1) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 100001090);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 368);
  EXPECT_EQ(map_searched_bnb.size(), 1);
  if (map_searched_bnb.size() == 1) {
    EXPECT_TRUE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
  }
}